

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

void __thiscall
iqxmlrpc::Auto_conn::Auto_conn(Auto_conn *this,Impl *client_impl,Client_base *client)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  scoped_ptr<iqxmlrpc::Client_connection> *this_00;
  
  this->client_impl_ = client_impl;
  this_00 = &this->tmp_conn_;
  (this->tmp_conn_).px = (Client_connection *)0x0;
  if ((client_impl->opts).keep_alive_ == true) {
    if ((client_impl->conn_cache).px == (Client_connection *)0x0) {
      iVar1 = (*client->_vptr_Client_base[3])(client);
      boost::scoped_ptr<iqxmlrpc::Client_connection>::reset
                (&client_impl->conn_cache,(Client_connection *)CONCAT44(extraout_var,iVar1));
    }
    this_00 = &this->client_impl_->conn_cache;
  }
  else {
    iVar1 = (*client->_vptr_Client_base[3])(client);
    boost::scoped_ptr<iqxmlrpc::Client_connection>::reset
              (this_00,(Client_connection *)CONCAT44(extraout_var_00,iVar1));
  }
  this->conn_ptr_ = this_00->px;
  return;
}

Assistant:

Auto_conn( Client_base::Impl& client_impl, Client_base& client ):
    client_impl_(client_impl)
  {
    if (opts().keep_alive())
    {
      if (!cimpl().conn_cache)
        cimpl().conn_cache.reset( create_connection(client) );

      conn_ptr_ = cimpl().conn_cache.get();

    } else {
      tmp_conn_.reset( create_connection(client) );
      conn_ptr_ = tmp_conn_.get();
    }
  }